

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::clearBufferfv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,float *value)

{
  int iVar1;
  bool bVar2;
  ConstPixelBufferAccess *pCVar3;
  InternalError *this_00;
  byte bVar4;
  int iVar5;
  ConstPixelBufferAccess *pCVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ConstPixelBufferAccess *pCVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  MultisamplePixelBufferAccess access;
  Vec4 color;
  MultisamplePixelBufferAccess colorBuf;
  MultisampleConstPixelBufferAccess local_b0;
  TextureFormat local_88;
  int aiStack_80 [2];
  undefined1 local_78 [72];
  
  if (buffer - 0x1802 < 0xfffffffe) {
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
  }
  else if (drawbuffer == 0) {
    if (this->m_scissorEnabled == true) {
      iVar14 = (this->m_scissorBox).m_data[3];
      iVar10 = (this->m_scissorBox).m_data[2];
      iVar13 = (this->m_scissorBox).m_data[0];
      iVar12 = (this->m_scissorBox).m_data[1];
    }
    else {
      iVar12 = 0;
      iVar14 = 0x7fffffff;
      iVar10 = 0x7fffffff;
      iVar13 = 0;
    }
    if (buffer == 0x1801) {
      getDrawDepthbuffer((MultisamplePixelBufferAccess *)(local_78 + 0x10),this);
      rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                (&local_b0,(MultisamplePixelBufferAccess *)(local_78 + 0x10));
      iVar8 = 0;
      if (0 < iVar13) {
        iVar8 = iVar13;
      }
      iVar5 = 0;
      if (0 < iVar12) {
        iVar5 = iVar12;
      }
      iVar1 = iVar10 + iVar13;
      if (local_b0.m_access.m_size.m_data[1] <= iVar10 + iVar13) {
        iVar1 = local_b0.m_access.m_size.m_data[1];
      }
      iVar10 = iVar14 + iVar12;
      if (local_b0.m_access.m_size.m_data[2] <= iVar14 + iVar12) {
        iVar10 = local_b0.m_access.m_size.m_data[2];
      }
      iVar10 = iVar10 - iVar5;
      iVar14 = 0;
      if (0 < iVar10) {
        iVar14 = iVar10;
      }
      if (((0 < iVar1 - iVar8) && (0 < iVar10)) && (this->m_depthMask == true)) {
        rr::getSubregion((MultisamplePixelBufferAccess *)&local_b0,
                         (MultisamplePixelBufferAccess *)(local_78 + 0x10),iVar8,iVar5,iVar1 - iVar8
                         ,iVar14);
        rr::clearDepth((MultisamplePixelBufferAccess *)&local_b0,*value);
      }
    }
    else {
      if (buffer != 0x1800) {
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_00,(char *)0x0,"buffer == GL_DEPTH",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0xdad);
        __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      getDrawColorbuffer((MultisamplePixelBufferAccess *)(local_78 + 0x10),this);
      bVar2 = (this->m_colorMask).m_data[0];
      bVar4 = 1;
      if (((bVar2 == true) && ((this->m_colorMask).m_data[1] == true)) &&
         ((this->m_colorMask).m_data[2] == true)) {
        bVar4 = (this->m_colorMask).m_data[3] ^ 1;
      }
      bVar7 = 0;
      if (bVar2 == false) {
        if (((this->m_colorMask).m_data[1] == false) && ((this->m_colorMask).m_data[2] == false)) {
          bVar7 = (this->m_colorMask).m_data[3] ^ 1;
        }
        else {
          bVar7 = 0;
        }
      }
      rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                (&local_b0,(MultisamplePixelBufferAccess *)(local_78 + 0x10));
      iVar8 = 0;
      if (0 < iVar13) {
        iVar8 = iVar13;
      }
      iVar5 = 0;
      if (0 < iVar12) {
        iVar5 = iVar12;
      }
      iVar1 = iVar10 + iVar13;
      if (local_b0.m_access.m_size.m_data[1] <= iVar10 + iVar13) {
        iVar1 = local_b0.m_access.m_size.m_data[1];
      }
      iVar10 = iVar14 + iVar12;
      if (local_b0.m_access.m_size.m_data[2] <= iVar14 + iVar12) {
        iVar10 = local_b0.m_access.m_size.m_data[2];
      }
      if (((0 < iVar1 - iVar8) && (0 < iVar10 - iVar5)) && (bVar7 == 0)) {
        rr::getSubregion((MultisamplePixelBufferAccess *)&local_b0,
                         (MultisamplePixelBufferAccess *)(local_78 + 0x10),iVar8,iVar5,iVar1 - iVar8
                         ,iVar10 - iVar5);
        local_78._0_4_ = value[0];
        local_78._4_4_ = value[1];
        local_78._8_8_ = *(undefined8 *)(value + 2);
        if ((this->m_sRGBUpdateEnabled == true) &&
           (bVar2 = tcu::isSRGB(local_b0.m_access.m_format), bVar2)) {
          tcu::linearToSRGB((tcu *)&local_88,(Vec4 *)local_78);
          local_78._0_4_ = local_88.order;
          local_78._4_4_ = local_88.type;
          local_78._8_4_ = aiStack_80[0];
          local_78._12_4_ = aiStack_80[1];
        }
        if (bVar4 == 0) {
          rr::clear((MultisamplePixelBufferAccess *)&local_b0,(Vec4 *)local_78);
        }
        else if (0 < local_b0.m_access.m_size.m_data[2]) {
          iVar14 = 0;
          do {
            if (0 < local_b0.m_access.m_size.m_data[1]) {
              iVar10 = 0;
              do {
                if (0 < local_b0.m_access.m_size.m_data[0]) {
                  iVar13 = 0;
                  do {
                    tcu::ConstPixelBufferAccess::getPixel
                              ((ConstPixelBufferAccess *)(local_78 + 0x38),(int)&local_b0,iVar13,
                               iVar10);
                    local_88.order = R;
                    local_88.type = SNORM_INT8;
                    aiStack_80[0] = 0;
                    aiStack_80[1] = 0;
                    pCVar3 = (ConstPixelBufferAccess *)local_78;
                    lVar9 = 0;
                    pCVar6 = (ConstPixelBufferAccess *)(local_78 + 0x38);
                    do {
                      pCVar11 = pCVar3;
                      if ((this->m_colorMask).m_data[lVar9] == false) {
                        pCVar11 = pCVar6;
                      }
                      (&local_88.order)[lVar9] = (pCVar11->m_format).order;
                      lVar9 = lVar9 + 1;
                      pCVar6 = (ConstPixelBufferAccess *)&(pCVar6->m_format).type;
                      pCVar3 = (ConstPixelBufferAccess *)&(pCVar3->m_format).type;
                    } while (lVar9 != 4);
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)&local_b0,(Vec4 *)&local_88,iVar13,iVar10,iVar14
                              );
                    iVar13 = iVar13 + 1;
                  } while (iVar13 < local_b0.m_access.m_size.m_data[0]);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < local_b0.m_access.m_size.m_data[1]);
            }
            iVar14 = iVar14 + 1;
          } while (iVar14 < local_b0.m_access.m_size.m_data[2]);
        }
      }
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferfv (deUint32 buffer, int drawbuffer, const float* value)
{
	RC_IF_ERROR(buffer != GL_COLOR && buffer != GL_DEPTH, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	if (buffer == GL_COLOR)
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			Vec4								color		(value[0], value[1], value[2], value[3]);

			if (m_sRGBUpdateEnabled && tcu::isSRGB(access.raw().getFormat()))
				color = tcu::linearToSRGB(color);

			if (!maskUsed)
				rr::clear(access, color);
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixel(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
	else
	{
		TCU_CHECK_INTERNAL(buffer == GL_DEPTH);

		rr::MultisamplePixelBufferAccess	depthBuf	= getDrawDepthbuffer();
		IVec4								area		= intersect(baseArea, getBufferRect(depthBuf));

		if (!isEmpty(area) && m_depthMask)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(depthBuf, area.x(), area.y(), area.z(), area.w());
			float								depth		= value[0];

			rr::clearDepth(access, depth);
		}
	}
}